

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

bool __thiscall
TPZMatrix<std::complex<long_double>_>::Compare
          (TPZMatrix<std::complex<long_double>_> *this,TPZSavable *copy,bool override)

{
  ostream *poVar1;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  stringstream sout;
  bool result;
  TPZMatrix<std::complex<long_double>_> *copmat;
  TPZMatrix<std::complex<long_double>_> *in_stack_fffffffffffffde8;
  ostream *in_stack_fffffffffffffdf0;
  long local_200;
  string local_1e8 [48];
  stringstream local_1b8 [16];
  ostream local_1a8 [383];
  byte local_29;
  long local_28;
  byte local_19;
  bool local_1;
  
  local_19 = in_DL & 1;
  if (in_RSI == 0) {
    local_200 = 0;
  }
  else {
    local_200 = __dynamic_cast(in_RSI,&TPZSavable::typeinfo,
                               &TPZMatrix<std::complex<long_double>>::typeinfo,0);
  }
  local_28 = local_200;
  if (local_200 == 0) {
    local_1 = false;
  }
  else {
    local_29 = 1;
    if (((*(long *)(in_RDI + 8) != *(long *)(local_200 + 8)) ||
        (*(long *)(in_RDI + 0x10) != *(long *)(local_200 + 0x10))) ||
       (*(char *)(in_RDI + 0x18) != *(char *)(local_200 + 0x18))) {
      local_29 = 0;
    }
    if (local_29 == 0) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar1 = std::operator<<(local_1a8,
                               "virtual bool TPZMatrix<std::complex<long double>>::Compare(TPZSavable *, bool) [T = std::complex<long double>]"
                              );
      std::operator<<(poVar1," did not compare ");
      std::__cxx11::stringstream::str();
      in_stack_fffffffffffffdf0 = std::operator<<((ostream *)&std::cout,local_1e8);
      std::ostream::operator<<(in_stack_fffffffffffffdf0,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::stringstream::~stringstream(local_1b8);
    }
    if (((local_19 & 1) != 0) && ((local_29 & 1) == 0)) {
      operator=((TPZMatrix<std::complex<long_double>_> *)in_stack_fffffffffffffdf0,
                in_stack_fffffffffffffde8);
    }
    local_1 = (bool)(local_29 & 1);
  }
  return local_1;
}

Assistant:

bool TPZMatrix<TVar>::Compare(TPZSavable *copy, bool override)
{
	TPZMatrix<TVar> *copmat = dynamic_cast<TPZMatrix<TVar> *> (copy);
	if(!copmat) return false;
	bool result = true;
	if(fRow != copmat->fRow || fCol != copmat->fCol || fDecomposed != copmat->fDecomposed) result = false;
	if(!result)
	{
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " did not compare ";
		LOGPZ_ERROR(loggerCheck,sout.str())
	}
	if(override && !result)
	{
		this->operator=(*copmat);
	}
	return result;
}